

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O3

void __thiscall VersionBitsTester::VersionBitsTester(VersionBitsTester *this,FastRandomContext *rng)

{
  long lVar1;
  long lVar2;
  _Base_ptr p_Var3;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_rng = rng;
  (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = &this->checker[0].cache._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar4 = 0x150;
  do {
    *(undefined ***)((long)(p_Var3 + -1) + 0x10) = &PTR_Condition_0138efb0;
    ((_Rb_tree_node_base *)&p_Var3->_M_color)->_M_color = _S_red;
    p_Var3->_M_parent = (_Base_ptr)0x0;
    p_Var3->_M_left = p_Var3;
    p_Var3->_M_right = p_Var3;
    *(undefined8 *)(p_Var3 + 1) = 0;
    p_Var3 = (_Base_ptr)&p_Var3[1]._M_right;
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    lVar1 = (long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
                   super__Rb_tree_header._M_header + lVar4;
    *(undefined4 *)
     ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4) = 0;
    *(undefined8 *)
     ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4 + 8U) = 0;
    *(long *)((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x10U) = lVar1;
    *(long *)((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x18U) = lVar1;
    *(undefined8 *)
     ((long)&this->checker_delayed[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_node_count + lVar4) = 0;
    *(undefined ***)
     ((long)&this->checker_delayed[0].super_TestConditionChecker.
             super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker + lVar4
     ) = &PTR_Condition_0138f018;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x150);
  lVar4 = 0;
  do {
    lVar1 = (long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                   super__Rb_tree_header._M_header + lVar4;
    *(undefined4 *)
     ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4) = 0;
    *(undefined8 *)
     ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4 + 8U) = 0;
    *(long *)((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x10U) = lVar1;
    *(long *)((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x18U) = lVar1;
    *(undefined8 *)
     ((long)&this->checker_always[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_node_count + lVar4) = 0;
    *(undefined ***)
     ((long)&this->checker_always[0].super_TestConditionChecker.
             super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker + lVar4
     ) = &PTR_Condition_0138f070;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x150);
  lVar4 = 0;
  do {
    lVar1 = (long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                   super__Rb_tree_header._M_header + lVar4;
    *(undefined4 *)
     ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4) = 0;
    *(undefined8 *)
     ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_header + lVar4 + 8U) = 0;
    *(long *)((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x10U) = lVar1;
    *(long *)((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
                     super__Rb_tree_header._M_header + lVar4 + 0x18U) = lVar1;
    *(undefined8 *)
     ((long)&this->checker_never[0].super_TestConditionChecker.cache._M_t._M_impl.
             super__Rb_tree_header._M_node_count + lVar4) = 0;
    *(undefined ***)
     ((long)&this->checker_never[0].super_TestConditionChecker.
             super_AbstractThresholdConditionChecker._vptr_AbstractThresholdConditionChecker + lVar4
     ) = &PTR_Condition_0138f0c8;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x150);
  this->num = 1000;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester(FastRandomContext& rng) : m_rng{rng} {}